

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# translate.c
# Opt level: O2

void gen_std(DisasContext_conflict10 *ctx)

{
  uint uVar1;
  int iVar2;
  TCGContext_conflict10 *tcg_ctx;
  uint64_t uVar3;
  TCGv_i64 val;
  TCGv_ptr pTVar4;
  TCGv_i64 pTVar5;
  TCGv_i64 EA;
  TCGv_i32 ret;
  MemOp_conflict memop;
  uintptr_t o_2;
  code *func;
  uint uVar6;
  uintptr_t o_1;
  uintptr_t o;
  uintptr_t o_6;
  TCGTemp *local_58;
  TCGv_i64 local_50;
  TCGv_i64 local_48;
  TCGv_i64 local_40;
  TCGv_i32 local_38;
  
  tcg_ctx = ctx->uc->tcg_ctx;
  uVar1 = ctx->opcode;
  uVar6 = uVar1 >> 0x15 & 0x1f;
  if ((uVar1 & 3) == 2) {
    uVar3 = ctx->insns_flags2;
    if ((ctx->insns_flags & 0x40) == 0) {
      gen_inval_exception(ctx,1);
    }
    if (((uint)uVar3 >> 0xd & 1) == 0) {
      if (ctx->pr == true) {
        gen_priv_exception(ctx,1);
        return;
      }
      if (ctx->le_mode == true) {
        gen_align_no_le(ctx);
        return;
      }
    }
    if ((uVar1 >> 0x15 & 1) == 0) {
      gen_set_access_type(ctx,0x20);
      EA = tcg_temp_new_i64(tcg_ctx);
      gen_addr_imm_index(ctx,EA,3);
      pTVar5 = *(TCGv_i64 *)((long)cpu_gpr + (ulong)(uVar6 * 8 | 8));
      val = cpu_gpr[uVar6];
      if ((((ctx->base).tb)->cflags & 0x80000) == 0) {
        if (ctx->le_mode == true) {
          memop = MO_64;
          tcg_gen_qemu_st_i64_ppc64(tcg_ctx,pTVar5,EA,(long)ctx->mem_idx,MO_64);
          gen_addr_add(ctx,EA,EA,8);
          iVar2 = ctx->mem_idx;
          pTVar5 = val;
        }
        else {
          memop = MO_BEQ;
          tcg_gen_qemu_st_i64_ppc64(tcg_ctx,val,EA,(long)ctx->mem_idx,MO_BEQ);
          gen_addr_add(ctx,EA,EA,8);
          iVar2 = ctx->mem_idx;
        }
        tcg_gen_qemu_st_i64_ppc64(tcg_ctx,pTVar5,EA,(long)iVar2,memop);
      }
      else {
        ret = tcg_temp_new_i32(tcg_ctx);
        if (ctx->le_mode == true) {
          tcg_gen_movi_i32(tcg_ctx,ret,ctx->mem_idx | 0x30);
          pTVar4 = tcg_ctx->cpu_env;
          func = helper_stq_le_parallel;
        }
        else {
          tcg_gen_movi_i32(tcg_ctx,ret,ctx->mem_idx | 0xb0);
          pTVar4 = tcg_ctx->cpu_env;
          func = helper_stq_be_parallel;
        }
        local_38 = ret + (long)&tcg_ctx->pool_cur;
        local_40 = val + (long)tcg_ctx;
        local_48 = pTVar5 + (long)tcg_ctx;
        local_58 = (TCGTemp *)(pTVar4 + (long)tcg_ctx);
        local_50 = EA + (long)&tcg_ctx->pool_cur;
        tcg_gen_callN_ppc64(tcg_ctx,func,(TCGTemp *)0x0,5,&local_58);
        tcg_temp_free_internal_ppc64(tcg_ctx,(TCGTemp *)(ret + (long)tcg_ctx));
      }
      tcg_temp_free_internal_ppc64(tcg_ctx,(TCGTemp *)(EA + (long)tcg_ctx));
      return;
    }
  }
  else if ((uVar1 & 0x1f0001) != 1) {
    gen_set_access_type(ctx,0x20);
    pTVar5 = tcg_temp_new_i64(tcg_ctx);
    gen_addr_imm_index(ctx,pTVar5,3);
    gen_qemu_st64_i64(ctx,cpu_gpr[uVar6],pTVar5);
    if ((ctx->opcode & 1) != 0) {
      tcg_gen_mov_i64_ppc64
                (tcg_ctx,*(TCGv_i64 *)((long)cpu_gpr + (ulong)(ctx->opcode >> 0xd & 0xf8)),pTVar5);
    }
    tcg_temp_free_internal_ppc64(tcg_ctx,(TCGTemp *)(pTVar5 + (long)tcg_ctx));
    return;
  }
  gen_inval_exception(ctx,1);
  return;
}

Assistant:

static void gen_std(DisasContext *ctx)
{
    TCGContext *tcg_ctx = ctx->uc->tcg_ctx;
    int rs;
    TCGv EA;

    rs = rS(ctx->opcode);
    if ((ctx->opcode & 0x3) == 0x2) { /* stq */
        bool legal_in_user_mode = (ctx->insns_flags2 & PPC2_LSQ_ISA207) != 0;
        bool le_is_supported = (ctx->insns_flags2 & PPC2_LSQ_ISA207) != 0;
        TCGv hi, lo;

        if (!(ctx->insns_flags & PPC_64BX)) {
            gen_inval_exception(ctx, POWERPC_EXCP_INVAL_INVAL);
        }

        if (!legal_in_user_mode && ctx->pr) {
            gen_priv_exception(ctx, POWERPC_EXCP_PRIV_OPC);
            return;
        }

        if (!le_is_supported && ctx->le_mode) {
            gen_align_no_le(ctx);
            return;
        }

        if (unlikely(rs & 1)) {
            gen_inval_exception(ctx, POWERPC_EXCP_INVAL_INVAL);
            return;
        }
        gen_set_access_type(ctx, ACCESS_INT);
        EA = tcg_temp_new(tcg_ctx);
        gen_addr_imm_index(ctx, EA, 0x03);

        /* Note that the low part is always in RS+1, even in LE mode.  */
        lo = cpu_gpr[rs + 1];
        hi = cpu_gpr[rs];

        if (tb_cflags(ctx->base.tb) & CF_PARALLEL) {
            if (HAVE_ATOMIC128) {
                TCGv_i32 oi = tcg_temp_new_i32(tcg_ctx);
                if (ctx->le_mode) {
                    tcg_gen_movi_i32(tcg_ctx, oi, make_memop_idx(MO_LEQ, ctx->mem_idx));
                    gen_helper_stq_le_parallel(tcg_ctx, tcg_ctx->cpu_env, EA, lo, hi, oi);
                } else {
                    tcg_gen_movi_i32(tcg_ctx, oi, make_memop_idx(MO_BEQ, ctx->mem_idx));
                    gen_helper_stq_be_parallel(tcg_ctx, tcg_ctx->cpu_env, EA, lo, hi, oi);
                }
                tcg_temp_free_i32(tcg_ctx, oi);
            } else {
                /* Restart with exclusive lock.  */
                gen_helper_exit_atomic(tcg_ctx, tcg_ctx->cpu_env);
                ctx->base.is_jmp = DISAS_NORETURN;
            }
        } else if (ctx->le_mode) {
            tcg_gen_qemu_st_i64(tcg_ctx, lo, EA, ctx->mem_idx, MO_LEQ);
            gen_addr_add(ctx, EA, EA, 8);
            tcg_gen_qemu_st_i64(tcg_ctx, hi, EA, ctx->mem_idx, MO_LEQ);
        } else {
            tcg_gen_qemu_st_i64(tcg_ctx, hi, EA, ctx->mem_idx, MO_BEQ);
            gen_addr_add(ctx, EA, EA, 8);
            tcg_gen_qemu_st_i64(tcg_ctx, lo, EA, ctx->mem_idx, MO_BEQ);
        }
        tcg_temp_free(tcg_ctx, EA);
    } else {
        /* std / stdu */
        if (Rc(ctx->opcode)) {
            if (unlikely(rA(ctx->opcode) == 0)) {
                gen_inval_exception(ctx, POWERPC_EXCP_INVAL_INVAL);
                return;
            }
        }
        gen_set_access_type(ctx, ACCESS_INT);
        EA = tcg_temp_new(tcg_ctx);
        gen_addr_imm_index(ctx, EA, 0x03);
        gen_qemu_st64_i64(ctx, cpu_gpr[rs], EA);
        if (Rc(ctx->opcode)) {
            tcg_gen_mov_tl(tcg_ctx, cpu_gpr[rA(ctx->opcode)], EA);
        }
        tcg_temp_free(tcg_ctx, EA);
    }
}